

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddIte.c
# Opt level: O3

DdNode * cuddAddCmplRecur(DdManager *dd,DdNode *f)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *T;
  DdNode *data;
  
  if (f->index == 0x7fffffff) {
    pDVar2 = dd->zero;
    if (pDVar2 == f) {
      pDVar2 = dd->one;
    }
  }
  else {
    pDVar2 = cuddCacheLookup1(dd,Cudd_addCmpl,f);
    if (pDVar2 == (DdNode *)0x0) {
      pDVar2 = (f->type).kids.E;
      T = cuddAddCmplRecur(dd,(f->type).kids.T);
      if (T != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar2 = cuddAddCmplRecur(dd,pDVar2);
        if (pDVar2 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          data = T;
          if ((T == pDVar2) || (data = cuddUniqueInter(dd,f->index,T,pDVar2), data != (DdNode *)0x0)
             ) {
            piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            cuddCacheInsert1(dd,Cudd_addCmpl,f,data);
            return data;
          }
          Cudd_RecursiveDeref(dd,T);
          T = pDVar2;
        }
        Cudd_RecursiveDeref(dd,T);
      }
      pDVar2 = (DdNode *)0x0;
    }
  }
  return pDVar2;
}

Assistant:

DdNode *
cuddAddCmplRecur(
  DdManager * dd,
  DdNode * f)
{
    DdNode *one,*zero;
    DdNode *r,*Fv,*Fnv,*t,*e;

    statLine(dd);
    one = DD_ONE(dd);
    zero = DD_ZERO(dd); 

    if (cuddIsConstant(f)) {
        if (f == zero) {
            return(one);
        } else {
            return(zero);
        }
    }
    r = cuddCacheLookup1(dd,Cudd_addCmpl,f);
    if (r != NULL) {
        return(r);
    }
    Fv = cuddT(f);
    Fnv = cuddE(f);
    t = cuddAddCmplRecur(dd,Fv);
    if (t == NULL) return(NULL);
    cuddRef(t);
    e = cuddAddCmplRecur(dd,Fnv);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd,t);
        return(NULL);
    }
    cuddRef(e);
    r = (t == e) ? t : cuddUniqueInter(dd,(int)f->index,t,e);
    if (r == NULL) {
        Cudd_RecursiveDeref(dd, t);
        Cudd_RecursiveDeref(dd, e);
        return(NULL);
    }
    cuddDeref(t);
    cuddDeref(e);
    cuddCacheInsert1(dd,Cudd_addCmpl,f,r);
    return(r);

}